

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O0

void Vec_QueGrow(Vec_Que_t *p,int nCapMin)

{
  int *local_28;
  int *local_20;
  int nCapMin_local;
  Vec_Que_t *p_local;
  
  if (p->nCap < nCapMin) {
    if (p->pHeap == (int *)0x0) {
      local_20 = (int *)malloc((long)nCapMin << 2);
    }
    else {
      local_20 = (int *)realloc(p->pHeap,(long)nCapMin << 2);
    }
    p->pHeap = local_20;
    if (p->pOrder == (int *)0x0) {
      local_28 = (int *)malloc((long)nCapMin << 2);
    }
    else {
      local_28 = (int *)realloc(p->pOrder,(long)nCapMin << 2);
    }
    p->pOrder = local_28;
    memset(p->pHeap + p->nCap,0xff,(long)(nCapMin - p->nCap) << 2);
    memset(p->pOrder + p->nCap,0xff,(long)(nCapMin - p->nCap) << 2);
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_QueGrow( Vec_Que_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pHeap  = ABC_REALLOC( int, p->pHeap,  nCapMin );
    p->pOrder = ABC_REALLOC( int, p->pOrder, nCapMin ); 
    memset( p->pHeap  + p->nCap, 0xff, (size_t)(nCapMin - p->nCap) * sizeof(int) );
    memset( p->pOrder + p->nCap, 0xff, (size_t)(nCapMin - p->nCap) * sizeof(int) );
    p->nCap   = nCapMin;
}